

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

int execmd_recurs(voccxdef *ctx,objnum actor,objnum verb,objnum dobj,objnum prep,objnum iobj,
                 int validate_dobj,int validate_iobj)

{
  return 0;
}

Assistant:

int execmd_recurs(voccxdef *ctx, objnum actor, objnum verb,
                  objnum dobj, objnum prep, objnum iobj,
                  int validate_dobj, int validate_iobj)
{
    VARUSED(ctx);
    VARUSED(actor);
    VARUSED(verb);
    VARUSED(dobj);
    VARUSED(prep);
    VARUSED(iobj);
    return 0;
}